

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O2

void __thiscall
packing::AssignedProtos::assign<packing::ProtoPalAttrs>(AssignedProtos *this,ProtoPalAttrs *args)

{
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  this_00;
  
  this_00 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_negate<packing::AssignedProtos::assign<packing::ProtoPalAttrs>(packing::ProtoPalAttrs&&)::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                      ((this->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (this_00._M_current !=
      (this->_assigned).
      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::optional<packing::ProtoPalAttrs>::emplace<packing::ProtoPalAttrs>(this_00._M_current,args);
    return;
  }
  std::
  vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
  ::emplace_back<packing::ProtoPalAttrs>(&this->_assigned,args);
  return;
}

Assistant:

void assign(Ts &&...args) {
		auto freeSlot = std::find_if_not(
		    _assigned.begin(), _assigned.end(),
		    [](std::optional<ProtoPalAttrs> const &slot) { return slot.has_value(); });

		if (freeSlot == _assigned.end()) { // We are full, use a new slot
			_assigned.emplace_back(std::forward<Ts>(args)...);
		} else { // Reuse a free slot
			freeSlot->emplace(std::forward<Ts>(args)...);
		}
	}